

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_services.c
# Opt level: O0

int csp_cmp(uint16_t node,uint32_t timeout,uint8_t code,int msg_size,csp_cmp_message *msg)

{
  int iVar1;
  undefined1 in_DL;
  undefined4 in_ESI;
  undefined2 in_DI;
  undefined1 *in_R8;
  uint32_t unaff_retaddr;
  int status;
  int in_stack_ffffffffffffffcc;
  void *in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined3 in_stack_fffffffffffffff0;
  undefined2 in_stack_fffffffffffffff8;
  int local_4;
  
  *in_R8 = 0;
  in_R8[1] = in_DL;
  iVar1 = csp_transaction_w_opts
                    ((uint8_t)((ulong)in_R8 >> 0x18),(uint16_t)in_R8,
                     (uint8_t)((uint)in_stack_ffffffffffffffdc >> 0x18),in_stack_ffffffffffffffd8,
                     in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                     (void *)CONCAT44(in_ESI,CONCAT13(in_DL,in_stack_fffffffffffffff0)),
                     CONCAT22(in_DI,in_stack_fffffffffffffff8),unaff_retaddr);
  if (iVar1 == 0) {
    local_4 = -3;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int csp_cmp(uint16_t node, uint32_t timeout, uint8_t code, int msg_size, struct csp_cmp_message * msg) {
	msg->type = CSP_CMP_REQUEST;
	msg->code = code;
	int status = csp_transaction_w_opts(CSP_PRIO_NORM, node, CSP_CMP, timeout, msg, msg_size, msg, msg_size, CSP_O_CRC32);
	if (status == 0) {
		return CSP_ERR_TIMEDOUT;
	}

	return CSP_ERR_NONE;
}